

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

int __thiscall Mat::countNe(Mat *this,ll128 *b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  ll128 *plVar7;
  undefined8 extraout_RDX;
  char *in_RSI;
  int *in_RDI;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  byte bVar21;
  int j;
  int i;
  int ret;
  Mat *in_stack_ffffffffffffffb8;
  char local_38;
  char cStack_37;
  char cStack_36;
  char cStack_35;
  char cStack_34;
  char cStack_33;
  char cStack_32;
  char cStack_31;
  char cStack_30;
  char cStack_2f;
  char cStack_2e;
  char cStack_2d;
  char cStack_2c;
  char cStack_2b;
  char cStack_2a;
  char cStack_29;
  int local_1c;
  int local_18;
  int local_14;
  
  local_14 = 0;
  for (local_18 = 0; local_18 < *in_RDI; local_18 = local_18 + 1) {
    for (local_1c = 0; local_1c < in_RDI[1]; local_1c = local_1c + 1) {
      plVar7 = get(in_stack_ffffffffffffffb8,0,0x10fc3d);
      local_38 = (char)plVar7;
      cStack_37 = (char)((ulong)plVar7 >> 8);
      cStack_36 = (char)((ulong)plVar7 >> 0x10);
      cStack_35 = (char)((ulong)plVar7 >> 0x18);
      cStack_34 = (char)((ulong)plVar7 >> 0x20);
      cStack_33 = (char)((ulong)plVar7 >> 0x28);
      cStack_32 = (char)((ulong)plVar7 >> 0x30);
      cStack_31 = (char)((ulong)plVar7 >> 0x38);
      cStack_30 = (char)extraout_RDX;
      cStack_2f = (char)((ulong)extraout_RDX >> 8);
      cStack_2e = (char)((ulong)extraout_RDX >> 0x10);
      cStack_2d = (char)((ulong)extraout_RDX >> 0x18);
      cStack_2c = (char)((ulong)extraout_RDX >> 0x20);
      cStack_2b = (char)((ulong)extraout_RDX >> 0x28);
      cStack_2a = (char)((ulong)extraout_RDX >> 0x30);
      cStack_29 = (char)((ulong)extraout_RDX >> 0x38);
      cVar8 = -(cStack_36 == in_RSI[2]);
      cVar9 = -(cStack_35 == in_RSI[3]);
      cVar10 = -(cStack_34 == in_RSI[4]);
      cVar11 = -(cStack_33 == in_RSI[5]);
      cVar12 = -(cStack_32 == in_RSI[6]);
      cVar13 = -(cStack_31 == in_RSI[7]);
      cVar14 = -(cStack_30 == in_RSI[8]);
      cVar15 = -(cStack_2f == in_RSI[9]);
      cVar16 = -(cStack_2e == in_RSI[10]);
      cVar17 = -(cStack_2d == in_RSI[0xb]);
      cVar18 = -(cStack_2c == in_RSI[0xc]);
      cVar19 = -(cStack_2b == in_RSI[0xd]);
      cVar20 = -(cStack_2a == in_RSI[0xe]);
      bVar21 = -(cStack_29 == in_RSI[0xf]);
      auVar1[1] = -(cStack_37 == in_RSI[1]);
      auVar1[0] = -(local_38 == *in_RSI);
      auVar1[2] = cVar8;
      auVar1[3] = cVar9;
      auVar1[4] = cVar10;
      auVar1[5] = cVar11;
      auVar1[6] = cVar12;
      auVar1[7] = cVar13;
      auVar1[8] = cVar14;
      auVar1[9] = cVar15;
      auVar1[10] = cVar16;
      auVar1[0xb] = cVar17;
      auVar1[0xc] = cVar18;
      auVar1[0xd] = cVar19;
      auVar1[0xe] = cVar20;
      auVar1[0xf] = bVar21;
      auVar2[1] = -(cStack_37 == in_RSI[1]);
      auVar2[0] = -(local_38 == *in_RSI);
      auVar2[2] = cVar8;
      auVar2[3] = cVar9;
      auVar2[4] = cVar10;
      auVar2[5] = cVar11;
      auVar2[6] = cVar12;
      auVar2[7] = cVar13;
      auVar2[8] = cVar14;
      auVar2[9] = cVar15;
      auVar2[10] = cVar16;
      auVar2[0xb] = cVar17;
      auVar2[0xc] = cVar18;
      auVar2[0xd] = cVar19;
      auVar2[0xe] = cVar20;
      auVar2[0xf] = bVar21;
      auVar6[1] = cVar9;
      auVar6[0] = cVar8;
      auVar6[2] = cVar10;
      auVar6[3] = cVar11;
      auVar6[4] = cVar12;
      auVar6[5] = cVar13;
      auVar6[6] = cVar14;
      auVar6[7] = cVar15;
      auVar6[8] = cVar16;
      auVar6[9] = cVar17;
      auVar6[10] = cVar18;
      auVar6[0xb] = cVar19;
      auVar6[0xc] = cVar20;
      auVar6[0xd] = bVar21;
      auVar5[1] = cVar10;
      auVar5[0] = cVar9;
      auVar5[2] = cVar11;
      auVar5[3] = cVar12;
      auVar5[4] = cVar13;
      auVar5[5] = cVar14;
      auVar5[6] = cVar15;
      auVar5[7] = cVar16;
      auVar5[8] = cVar17;
      auVar5[9] = cVar18;
      auVar5[10] = cVar19;
      auVar5[0xb] = cVar20;
      auVar5[0xc] = bVar21;
      auVar4[1] = cVar11;
      auVar4[0] = cVar10;
      auVar4[2] = cVar12;
      auVar4[3] = cVar13;
      auVar4[4] = cVar14;
      auVar4[5] = cVar15;
      auVar4[6] = cVar16;
      auVar4[7] = cVar17;
      auVar4[8] = cVar18;
      auVar4[9] = cVar19;
      auVar4[10] = cVar20;
      auVar4[0xb] = bVar21;
      auVar3[1] = cVar12;
      auVar3[0] = cVar11;
      auVar3[2] = cVar13;
      auVar3[3] = cVar14;
      auVar3[4] = cVar15;
      auVar3[5] = cVar16;
      auVar3[6] = cVar17;
      auVar3[7] = cVar18;
      auVar3[8] = cVar19;
      auVar3[9] = cVar20;
      auVar3[10] = bVar21;
      if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 |
                   (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3 |
                   (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                   (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                   (ushort)((byte)(CONCAT19(bVar21,CONCAT18(cVar20,CONCAT17(cVar19,CONCAT16(cVar18,
                                                  CONCAT15(cVar17,CONCAT14(cVar16,CONCAT13(cVar15,
                                                  CONCAT12(cVar14,CONCAT11(cVar13,cVar12))))))))) >>
                                  7) & 1) << 6 |
                   (ushort)((byte)(CONCAT18(bVar21,CONCAT17(cVar20,CONCAT16(cVar19,CONCAT15(cVar18,
                                                  CONCAT14(cVar17,CONCAT13(cVar16,CONCAT12(cVar15,
                                                  CONCAT11(cVar14,cVar13)))))))) >> 7) & 1) << 7 |
                  (ushort)(bVar21 >> 7) << 0xf) != 0xffff) {
        local_14 = local_14 + 1;
      }
    }
  }
  return local_14;
}

Assistant:

int Mat::countNe(const ll128 &b) const {
    int ret = 0;
    for (int i = 0; i < r; i++)
        for (int j = 0; j < c; j++)
            if (get(i, j) != b)
                ret++;
    return ret;
}